

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O2

ErrorCode __thiscall ComponentManager::LoadLibrary(ComponentManager *this,char *name)

{
  ErrorCode EVar1;
  void *pvVar2;
  code *pcVar3;
  code *pcVar4;
  undefined8 uVar5;
  IModule *pIVar6;
  ModuleInfo *this_00;
  allocator<char> local_51;
  string local_50 [32];
  ModuleInfo *info;
  
  pvVar2 = (void *)dlopen(name,1);
  if (pvVar2 == (void *)0x0) {
    uVar5 = dlerror();
    jh_log_print(2,"virtual ErrorCode ComponentManager::LoadLibrary(const char *)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/ComponentManager.cpp"
                 ,0x54,"Failed to open shared lib \"%s\": %s",name,uVar5);
  }
  else {
    pcVar3 = (code *)dlsym(pvVar2,"JHCOM_LibraryEntry");
    pcVar4 = (code *)dlsym(pvVar2,"JHCOM_GetModule");
    if (pcVar3 != (code *)0x0 && pcVar4 != (code *)0x0) {
      EVar1 = (*pcVar3)(this);
      if (EVar1 != kNoError) {
        return EVar1;
      }
      pIVar6 = (IModule *)(*pcVar4)();
      (*(code *)**(undefined8 **)pIVar6)(pIVar6);
      (**(code **)(*(long *)pIVar6 + 0x30))(pIVar6);
      this_00 = (ModuleInfo *)
                operator_new(0x30,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/ComponentManager.cpp"
                             ,0x6b);
      std::__cxx11::string::string<std::allocator<char>>(local_50,name,&local_51);
      std::__cxx11::string::string((string *)this_00,local_50);
      this_00->mModule = pIVar6;
      this_00->mHandle = pvVar2;
      std::__cxx11::string::~string(local_50);
      info = this_00;
      JetHead::list<ComponentManager::ModuleInfo_*>::push_back(&this->mModules,&info);
      return kNoError;
    }
    jh_log_print(2,"virtual ErrorCode ComponentManager::LoadLibrary(const char *)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/ComponentManager.cpp"
                 ,0x5e,"Failed to get symbol");
  }
  return kLoadFailed;
}

Assistant:

ErrorCode ComponentManager::LoadLibrary( const char *name )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	IModule *mod = NULL;
	ErrorCode result = kNoError;
	
	LOG_NOTICE( "Opening Library: %s", name );
	
	ErrorCode (*LoadLibrary)( IComponentManager *mgr );
	IModule *(*GetModule)();
	void *handle = dlopen( name, RTLD_LAZY );
	
	if ( handle == NULL )
	{
		result = kLoadFailed;
		LOG_WARN( "Failed to open shared lib \"%s\": %s", name, dlerror() );
	}
	else
	{
		LoadLibrary = (ErrorCode (*)(IComponentManager *mgr))dlsym( handle, "JHCOM_LibraryEntry" );
		GetModule = (IModule *(*)())dlsym( handle, "JHCOM_GetModule" );

		if ( GetModule == NULL || LoadLibrary == NULL )
		{
			result = kLoadFailed;
			LOG_WARN( "Failed to get symbol" );
		}
		else
		{
			LOG( "LoadLibrary is %p", LoadLibrary );
			LOG( "RegisterServices is %p", GetModule );
			result = LoadLibrary( this );
			
			if ( result == kNoError )
			{
				mod = GetModule();
				mod->AddRef();
				mod->loadComponents();
				ModuleInfo *info = jh_new ModuleInfo( name, mod, handle );
				mModules.push_back( info );
			}
		}
	}
	
	return result;
}